

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  undefined8 uVar2;
  long *plVar3;
  uchar *pImage_data;
  int iVar4;
  Webcam usbcam;
  int actual_comps;
  ImgClass img;
  ofstream image2;
  ofstream JPG_file;
  Webcam local_49d;
  int local_49c;
  ImgClass local_498;
  ImgClass local_460;
  params local_428 [20];
  ios_base aiStack_330 [264];
  long local_228;
  filebuf local_220 [240];
  ios_base aiStack_130 [264];
  
  Webcam::Webcam(&local_49d,"/dev/video0",0xcc0,0x990);
  if (local_49d.isOpen == true) {
    Webcam::start(&local_49d);
    sleep(10);
    Webcam::getImg(&local_498,&local_49d);
    Webcam::stop(&local_49d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"getImg:",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"img.width:  ",0xc);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_498.width);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"img.height: ",0xc);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_498.height);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"img.size:   ",0xc);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_498.size);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::ofstream::ofstream(&local_228);
    std::ofstream::open((char *)&local_228,0x118f32);
    std::ostream::write((char *)&local_228,(long)local_498.data);
    std::ofstream::close();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_fe3b,0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    pImage_data = jpgd::decompress_jpeg_image_from_memory
                            (local_498.data,local_498.size,&local_498.width,&local_498.height,
                             &local_49c,3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"actual_comps:",0xd);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_49c);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_fe67,0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"width  = ",9);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_498.width);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"height = ",9);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_498.height);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size   = ",9);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_498.size);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    local_460.name._M_dataplus._M_p = (pointer)&local_460.name.field_2;
    local_460.data = (uchar *)0x0;
    local_460.width = local_498.width;
    local_460.height = local_498.height;
    local_460.size = local_498.size;
    local_460.name._M_string_length = 0;
    local_460.name.field_2._M_local_buf[0] = '\0';
    if (local_498.size != 0) {
      iVar4 = -1;
      if (-1 < local_498.size) {
        iVar4 = local_498.size;
      }
      local_460.data = (uchar *)operator_new__((long)iVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_fe9b,0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    local_428[0].m_quality = 0x32;
    local_428[0].m_subsampling = H2V2;
    local_428[0].m_no_chroma_discrim_flag = false;
    local_428[0].m_two_pass_flag = false;
    jpge::compress_image_to_jpeg_file_in_memory
              (local_460.data,&local_460.size,local_460.width,local_460.height,local_49c,pImage_data
               ,local_428);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_fea5,0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"width  = ",9);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_460.width);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"height = ",9);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_460.height);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size   = ",9);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_460.size);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::ofstream::ofstream(local_428);
    std::ofstream::open((char *)local_428,0x118fa2);
    std::ostream::write((char *)local_428,(long)local_460.data);
    std::ofstream::close();
    free(pImage_data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"end",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    uVar2 = ___throw_bad_array_new_length;
    lVar1 = _VTT;
    local_428[0].m_quality = _VTT;
    local_428[0].m_subsampling = std::ofstream::VTT_4;
    *(undefined8 *)((long)&local_428[0].m_quality + *(long *)(_VTT + -0x18)) =
         ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&local_428[0].m_no_chroma_discrim_flag);
    std::ios_base::~ios_base(aiStack_330);
    ImgClass::~ImgClass(&local_460);
    local_228 = lVar1;
    *(undefined8 *)(local_220 + *(long *)(lVar1 + -0x18) + -8) = uVar2;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(aiStack_130);
    ImgClass::~ImgClass(&local_498);
  }
  Webcam::~Webcam(&local_49d);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    Webcam usbcam("/dev/video0", 3264, 2448);
    if(!usbcam.isOpen) {
        return 0;
    }

    //测试单帧拍摄模式
    //ImgClass img = usbcam.snap();

    //测试流模式
    usbcam.start();     //开启后台线程处理
    sleep(10);          //后台线程运行10s(用于测试帧率)
    ImgClass img = usbcam.getImg(); //获取流中最新的jpg图片
    usbcam.stop();      //关闭并停止拍摄线程

    cout<<"getImg:"<<endl;
    cout<<"img.width:  "<<img.width<<endl;
    cout<<"img.height: "<<img.height<<endl;
    cout<<"img.size:   "<<img.size<<endl;

    //原图保存到文件"1.jpg"
    ofstream JPG_file;
    const char *jpgFile = "1.jpg";
    JPG_file.open(jpgFile);
    JPG_file.write((char *)img.data, img.size);
    JPG_file.close();

    //jpg解码 img.data -->> imgData;
    int actual_comps;   //通道数
    cout<<"开始解码..."<<endl;
    unsigned char *imgData = decompress_jpeg_image_from_memory(img.data, img.size, &img.width, &img.height, &actual_comps, 3);
    cout<<"actual_comps:"<<actual_comps<<endl;
    cout<<"解码结束！"<<endl;
    cout<<"width  = "<<img.width<<endl;
    cout<<"height = "<<img.height<<endl;
    cout<<"size   = "<<img.size<<endl;

    //jpg压缩编码
    ImgClass jpge(img.width, img.height, img.size); //初始化图像信息 for compress_image_to_jpeg_file_in_memory()
    cout<<"开始编码..."<<endl;
    compress_image_to_jpeg_file_in_memory(jpge.data, jpge.size, jpge.width, jpge.height, actual_comps, imgData);
    cout<<"编码结束!"<<endl;
    cout<<"width  = "<<jpge.width<<endl;
    cout<<"height = "<<jpge.height<<endl;
    cout<<"size   = "<<jpge.size<<endl;

    //重新压缩后图像保存到文件"2.jpg"
    ofstream image2;
    image2.open("2.jpg");
    image2.write((char *)jpge.data, jpge.size);
    image2.close();

    free(imgData);

    cout<<"end"<<endl;
    return 0;
}